

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_272f4d1::SumOfSquaresTest_Const_Test::TestBody(SumOfSquaresTest_Const_Test *this)

{
  undefined8 *puVar1;
  long lVar2;
  SEARCH_METHODS *message;
  uint uVar3;
  undefined2 in_FPUControlWord;
  undefined2 in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  uint res;
  RegisterStateCheckMMX reg_check_mmx;
  int16_t mem [256];
  Message local_270;
  uint local_264;
  AssertHelper local_260;
  internal local_258 [8];
  undefined2 local_250;
  undefined2 uStack_24e;
  undefined4 uStack_24c;
  undefined2 uStack_248;
  int16_t local_238 [2];
  undefined4 auStack_234 [129];
  
  uVar3 = 0;
  do {
    local_258[0] = SUB21(in_FPUControlWord,0);
    auVar5 = pshuflw(ZEXT416(uVar3),ZEXT416(uVar3),0);
    uVar4 = auVar5._0_4_;
    lVar2 = 0;
    do {
      *(undefined4 *)(local_238 + lVar2) = uVar4;
      *(undefined4 *)(local_238 + lVar2 + 2) = uVar4;
      *(undefined4 *)(local_238 + lVar2 + 4) = uVar4;
      *(undefined4 *)(local_238 + lVar2 + 6) = uVar4;
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x100);
    uStack_24c = (undefined4)in_FPUInstructionPointer;
    uStack_248 = (undefined2)((ulong)in_FPUInstructionPointer >> 0x20);
    local_250 = in_FPUTagWord;
    local_264 = (*(this->super_SumOfSquaresTest).func_)(local_238);
    libaom_test::RegisterStateCheckMMX::Check((RegisterStateCheckMMX *)local_258);
    local_270.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = uVar3 * uVar3 * 0x100;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (local_258,"256u * (v * v)","res",(uint *)&local_270,&local_264);
    if (local_258[0] == (internal)0x0) {
      testing::Message::Message(&local_270);
      puVar1 = (undefined8 *)CONCAT44(uStack_24c,CONCAT22(uStack_24e,local_250));
      message = "";
      if (puVar1 != (undefined8 *)0x0) {
        message = (SEARCH_METHODS *)*puVar1;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_260,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                 ,300,(char *)message);
      testing::internal::AssertHelper::operator=(&local_260,&local_270);
      testing::internal::AssertHelper::~AssertHelper(&local_260);
      if ((long *)CONCAT44(local_270.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (int)local_270.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_270.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (int)local_270.ss_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl) + 8))();
      }
    }
    puVar1 = (undefined8 *)CONCAT44(uStack_24c,CONCAT22(uStack_24e,local_250));
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x100);
  return;
}

Assistant:

TEST_P(SumOfSquaresTest, Const) { ConstTest(); }